

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

void __thiscall cppcms::form::iterator::next(iterator *this)

{
  pointer ppVar1;
  int iVar2;
  undefined8 in_RAX;
  long lVar3;
  _Elt_pointer puVar4;
  undefined4 extraout_var;
  uint uVar6;
  undefined8 uStack_38;
  form *pfVar5;
  
  pfVar5 = this->current_;
  uStack_38 = in_RAX;
  do {
    while( true ) {
      if (pfVar5 == (form *)0x0) {
        return;
      }
      uVar6 = this->offset_;
      ppVar1 = (pfVar5->elements_).
               super__Vector_base<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)uVar6 <
          (ulong)((long)(pfVar5->elements_).
                        super__Vector_base<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4)) break;
      puVar4 = (this->return_positions_).c.
               super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (puVar4 == (this->return_positions_).c.
                    super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur) {
        this->current_ = (form *)0x0;
        uVar6 = 0;
LAB_001f3b22:
        this->offset_ = uVar6;
        return;
      }
      if (puVar4 == (this->return_positions_).c.
                    super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first) {
        puVar4 = (this->return_positions_).c.
                 super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
      }
      this->offset_ = puVar4[-1];
      std::deque<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
                ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)this);
      iVar2 = (*(this->current_->super_base_form)._vptr_base_form[5])();
      pfVar5 = (form *)CONCAT44(extraout_var,iVar2);
      this->current_ = pfVar5;
    }
    pfVar5 = (form *)ppVar1[uVar6].first;
    if ((pfVar5 != (form *)0x0) &&
       (lVar3 = __dynamic_cast(pfVar5,&base_form::typeinfo,&widgets::base_widget::typeinfo,0),
       lVar3 != 0)) {
      uVar6 = uVar6 + 1;
      goto LAB_001f3b22;
    }
    this->current_ = pfVar5;
    uStack_38 = CONCAT44(uVar6 + 1,(undefined4)uStack_38);
    puVar4 = (this->return_positions_).c.
             super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (puVar4 == (this->return_positions_).c.
                  super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<unsigned_int,_std::allocator<unsigned_int>_>::_M_push_back_aux<unsigned_int>
                ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)this,
                 (uint *)((long)&uStack_38 + 4));
      pfVar5 = this->current_;
    }
    else {
      *puVar4 = uVar6 + 1;
      (this->return_positions_).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_cur = puVar4 + 1;
    }
    this->offset_ = 0;
  } while( true );
}

Assistant:

void form::iterator::next()
{
	for(;;) {
		if(!current_)
			return;
		if(offset_ >=current_->elements_.size()) {
			if(return_positions_.empty()) {
				zero();
				return;
			}
			offset_ = return_positions_.top();
			return_positions_.pop();
			current_ = current_->parent();
		}
		else if(dynamic_cast<widgets::base_widget *>(current_->elements_[offset_].first)!=0) {
			offset_++;
			return;
		}
		else {
			// Elements can be only base_widget or form... so it should be safe
			current_ = static_cast<form *>(current_->elements_[offset_].first);
			return_positions_.push(offset_+1);
			offset_=0;
		}
	}
}